

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMvIntersectorKMoeller<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  float *pfVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined4 uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  RTCRayN *pRVar18;
  long lVar19;
  ulong uVar20;
  ulong unaff_RBP;
  size_t mask;
  NodeRef *pNVar21;
  ulong uVar22;
  ulong uVar23;
  size_t sVar24;
  ulong uVar25;
  bool bVar26;
  bool bVar27;
  float fVar28;
  uint uVar29;
  float fVar32;
  float fVar34;
  vint4 bi;
  uint uVar33;
  uint uVar35;
  float fVar36;
  uint uVar37;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar38;
  uint uVar39;
  uint uVar40;
  float fVar41;
  float fVar48;
  float fVar52;
  vint4 ai;
  uint uVar49;
  uint uVar50;
  float fVar51;
  uint uVar53;
  uint uVar54;
  float fVar55;
  float fVar56;
  uint uVar57;
  uint uVar58;
  float fVar59;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint uVar60;
  uint uVar65;
  uint uVar67;
  vint4 ai_1;
  float fVar61;
  float fVar66;
  float fVar68;
  uint uVar70;
  float fVar71;
  undefined1 auVar62 [16];
  float fVar69;
  float fVar72;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar73;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  uint uVar90;
  float fVar91;
  float fVar92;
  int iVar93;
  float fVar94;
  int iVar95;
  float fVar96;
  int iVar97;
  float fVar98;
  int iVar99;
  float fVar100;
  int iVar101;
  float fVar102;
  int iVar103;
  float fVar104;
  int iVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar117;
  float fVar118;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  ulong local_ad8;
  undefined1 local_a98 [16];
  ulong local_a88;
  ulong local_a80;
  ulong local_a78;
  ulong local_a70;
  ulong local_a68;
  NodeRef *local_a60;
  ulong local_a58;
  Scene *local_a50;
  int local_a48;
  int iStack_a44;
  int iStack_a40;
  int iStack_a3c;
  int local_a38;
  int iStack_a34;
  int iStack_a30;
  int iStack_a2c;
  float local_a28;
  float fStack_a24;
  float fStack_a20;
  float fStack_a1c;
  float local_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float local_a08;
  float fStack_a04;
  float fStack_a00;
  float fStack_9fc;
  float local_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float local_9e8;
  float fStack_9e4;
  float fStack_9e0;
  float fStack_9dc;
  float local_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  undefined1 (*local_9c8) [16];
  ulong local_9c0;
  RTCFilterFunctionNArguments args;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined1 local_978 [8];
  float fStack_970;
  float fStack_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  undefined1 local_938 [8];
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  undefined1 local_908 [16];
  undefined1 local_8f8 [16];
  undefined1 local_8e8 [16];
  float local_8d8 [4];
  undefined1 local_8c8 [8];
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8 [4];
  float local_8a8 [4];
  undefined1 local_898 [16];
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined1 local_848 [16];
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  uint local_828;
  uint uStack_824;
  uint uStack_820;
  uint uStack_81c;
  uint local_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint local_808;
  uint uStack_804;
  uint uStack_800;
  uint uStack_7fc;
  undefined1 local_7f8 [16];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  NodeRef stack [244];
  
  stack[0] = root;
  fVar91 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar96 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar69 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar72 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar82 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar83 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_a68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_a70 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_a78 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_a80 = local_a68 ^ 0x10;
  uVar25 = local_a70 ^ 0x10;
  uVar22 = local_a78 ^ 0x10;
  iVar15 = (tray->tnear).field_0.i[k];
  iVar99 = (tray->tfar).field_0.i[k];
  uVar90 = 0x224ff80;
  local_7e8 = mm_lookupmask_ps._0_8_;
  uStack_7e0 = mm_lookupmask_ps._8_8_;
  local_7f8 = mm_lookupmask_ps._240_16_;
  local_9c8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_a60 = stack + 1;
  fVar84 = fVar69;
  fVar85 = fVar69;
  fVar73 = fVar69;
  fVar79 = fVar72;
  fVar80 = fVar72;
  fVar81 = fVar72;
  fVar61 = fVar82;
  fVar66 = fVar82;
  fVar68 = fVar82;
  fVar71 = fVar83;
  fVar41 = fVar83;
  fVar51 = fVar83;
  iVar93 = iVar15;
  iVar95 = iVar15;
  iVar97 = iVar15;
  iVar101 = iVar99;
  iVar103 = iVar99;
  iVar105 = iVar99;
  fVar55 = fVar91;
  fVar59 = fVar91;
  fVar86 = fVar91;
  fVar87 = fVar96;
  fVar88 = fVar96;
  fVar89 = fVar96;
  local_a48 = iVar99;
  iStack_a44 = iVar99;
  iStack_a40 = iVar99;
  iStack_a3c = iVar99;
  local_a38 = iVar15;
  iStack_a34 = iVar15;
  iStack_a30 = iVar15;
  iStack_a2c = iVar15;
  local_a28 = fVar83;
  fStack_a24 = fVar83;
  fStack_a20 = fVar83;
  fStack_a1c = fVar83;
  local_a18 = fVar82;
  fStack_a14 = fVar82;
  fStack_a10 = fVar82;
  fStack_a0c = fVar82;
  local_a08 = fVar72;
  fStack_a04 = fVar72;
  fStack_a00 = fVar72;
  fStack_9fc = fVar72;
  local_9f8 = fVar69;
  fStack_9f4 = fVar69;
  fStack_9f0 = fVar69;
  fStack_9ec = fVar69;
  local_9e8 = fVar96;
  fStack_9e4 = fVar96;
  fStack_9e0 = fVar96;
  fStack_9dc = fVar96;
  local_9d8 = fVar91;
  fStack_9d4 = fVar91;
  fStack_9d0 = fVar91;
  fStack_9cc = fVar91;
  local_9c0 = uVar22;
LAB_0027eb75:
  pNVar21 = local_a60;
  if (pNVar21 != stack) {
    local_a60 = pNVar21 + -1;
    sVar24 = pNVar21[-1].ptr;
    do {
      if ((sVar24 & 8) == 0) {
        pfVar1 = (float *)(sVar24 + 0x20 + local_a68);
        fVar28 = (*pfVar1 - fVar91) * fVar72;
        fVar32 = (pfVar1[1] - fVar55) * fVar79;
        fVar34 = (pfVar1[2] - fVar59) * fVar80;
        fVar36 = (pfVar1[3] - fVar86) * fVar81;
        pfVar1 = (float *)(sVar24 + 0x20 + local_a70);
        fVar38 = (*pfVar1 - fVar96) * fVar82;
        fVar48 = (pfVar1[1] - fVar87) * fVar61;
        fVar52 = (pfVar1[2] - fVar88) * fVar66;
        fVar56 = (pfVar1[3] - fVar89) * fVar68;
        uVar39 = (uint)((int)fVar38 < (int)fVar28) * (int)fVar28 |
                 (uint)((int)fVar38 >= (int)fVar28) * (int)fVar38;
        uVar49 = (uint)((int)fVar48 < (int)fVar32) * (int)fVar32 |
                 (uint)((int)fVar48 >= (int)fVar32) * (int)fVar48;
        uVar53 = (uint)((int)fVar52 < (int)fVar34) * (int)fVar34 |
                 (uint)((int)fVar52 >= (int)fVar34) * (int)fVar52;
        uVar57 = (uint)((int)fVar56 < (int)fVar36) * (int)fVar36 |
                 (uint)((int)fVar56 >= (int)fVar36) * (int)fVar56;
        pfVar1 = (float *)(sVar24 + 0x20 + local_a78);
        fVar28 = (*pfVar1 - fVar69) * fVar83;
        fVar32 = (pfVar1[1] - fVar84) * fVar71;
        fVar34 = (pfVar1[2] - fVar85) * fVar41;
        fVar36 = (pfVar1[3] - fVar73) * fVar51;
        uVar29 = (uint)((int)fVar28 < iVar15) * iVar15 | (uint)((int)fVar28 >= iVar15) * (int)fVar28
        ;
        uVar33 = (uint)((int)fVar32 < iVar93) * iVar93 | (uint)((int)fVar32 >= iVar93) * (int)fVar32
        ;
        uVar35 = (uint)((int)fVar34 < iVar95) * iVar95 | (uint)((int)fVar34 >= iVar95) * (int)fVar34
        ;
        uVar37 = (uint)((int)fVar36 < iVar97) * iVar97 | (uint)((int)fVar36 >= iVar97) * (int)fVar36
        ;
        pfVar1 = (float *)(sVar24 + 0x20 + local_a80);
        fVar28 = (*pfVar1 - fVar91) * fVar72;
        fVar32 = (pfVar1[1] - fVar55) * fVar79;
        fVar34 = (pfVar1[2] - fVar59) * fVar80;
        fVar36 = (pfVar1[3] - fVar86) * fVar81;
        pfVar1 = (float *)(sVar24 + 0x20 + uVar25);
        fVar38 = (*pfVar1 - fVar96) * fVar82;
        fVar48 = (pfVar1[1] - fVar87) * fVar61;
        fVar52 = (pfVar1[2] - fVar88) * fVar66;
        fVar56 = (pfVar1[3] - fVar89) * fVar68;
        uVar60 = (uint)((int)fVar28 < (int)fVar38) * (int)fVar28 |
                 (uint)((int)fVar28 >= (int)fVar38) * (int)fVar38;
        uVar65 = (uint)((int)fVar32 < (int)fVar48) * (int)fVar32 |
                 (uint)((int)fVar32 >= (int)fVar48) * (int)fVar48;
        uVar67 = (uint)((int)fVar34 < (int)fVar52) * (int)fVar34 |
                 (uint)((int)fVar34 >= (int)fVar52) * (int)fVar52;
        uVar70 = (uint)((int)fVar36 < (int)fVar56) * (int)fVar36 |
                 (uint)((int)fVar36 >= (int)fVar56) * (int)fVar56;
        pfVar1 = (float *)(sVar24 + 0x20 + uVar22);
        fVar28 = (*pfVar1 - fVar69) * fVar83;
        fVar32 = (pfVar1[1] - fVar84) * fVar71;
        fVar34 = (pfVar1[2] - fVar85) * fVar41;
        fVar36 = (pfVar1[3] - fVar73) * fVar51;
        uVar40 = (uint)(iVar99 < (int)fVar28) * iVar99 | (uint)(iVar99 >= (int)fVar28) * (int)fVar28
        ;
        uVar50 = (uint)(iVar101 < (int)fVar32) * iVar101 |
                 (uint)(iVar101 >= (int)fVar32) * (int)fVar32;
        uVar54 = (uint)(iVar103 < (int)fVar34) * iVar103 |
                 (uint)(iVar103 >= (int)fVar34) * (int)fVar34;
        uVar58 = (uint)(iVar105 < (int)fVar36) * iVar105 |
                 (uint)(iVar105 >= (int)fVar36) * (int)fVar36;
        auVar77._0_4_ =
             -(uint)((int)(((int)uVar60 < (int)uVar40) * uVar60 |
                          ((int)uVar60 >= (int)uVar40) * uVar40) <
                    (int)(((int)uVar29 < (int)uVar39) * uVar39 |
                         ((int)uVar29 >= (int)uVar39) * uVar29));
        auVar77._4_4_ =
             -(uint)((int)(((int)uVar65 < (int)uVar50) * uVar65 |
                          ((int)uVar65 >= (int)uVar50) * uVar50) <
                    (int)(((int)uVar33 < (int)uVar49) * uVar49 |
                         ((int)uVar33 >= (int)uVar49) * uVar33));
        auVar77._8_4_ =
             -(uint)((int)(((int)uVar67 < (int)uVar54) * uVar67 |
                          ((int)uVar67 >= (int)uVar54) * uVar54) <
                    (int)(((int)uVar35 < (int)uVar53) * uVar53 |
                         ((int)uVar35 >= (int)uVar53) * uVar35));
        auVar77._12_4_ =
             -(uint)((int)(((int)uVar70 < (int)uVar58) * uVar70 |
                          ((int)uVar70 >= (int)uVar58) * uVar58) <
                    (int)(((int)uVar37 < (int)uVar57) * uVar57 |
                         ((int)uVar37 >= (int)uVar57) * uVar37));
        uVar14 = movmskps(uVar90,auVar77);
        unaff_RBP = (ulong)(byte)((byte)uVar14 ^ 0xf);
      }
      uVar90 = 6;
      if ((sVar24 & 8) == 0) {
        if (unaff_RBP == 0) {
          uVar90 = 4;
        }
        else {
          uVar23 = sVar24 & 0xfffffffffffffff0;
          lVar19 = 0;
          if (unaff_RBP != 0) {
            for (; (unaff_RBP >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
            }
          }
          sVar24 = *(size_t *)(uVar23 + lVar19 * 8);
          uVar20 = unaff_RBP - 1 & unaff_RBP;
          if (uVar20 != 0) {
            local_a60->ptr = sVar24;
            lVar19 = 0;
            if (uVar20 != 0) {
              for (; (uVar20 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            uVar16 = uVar20 - 1;
            while( true ) {
              local_a60 = local_a60 + 1;
              sVar24 = *(size_t *)(uVar23 + lVar19 * 8);
              uVar16 = uVar16 & uVar20;
              if (uVar16 == 0) break;
              local_a60->ptr = sVar24;
              lVar19 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                }
              }
              uVar20 = uVar16 - 1;
            }
          }
          uVar90 = 0;
        }
      }
    } while (uVar90 == 0);
    if (uVar90 == 6) {
      uVar90 = 0;
      local_a88 = (ulong)((uint)sVar24 & 0xf) - 8;
      bVar26 = local_a88 != 0;
      if (bVar26) {
        uVar22 = sVar24 & 0xfffffffffffffff0;
        uVar23 = 0;
        do {
          lVar17 = uVar23 * 0xe0;
          puVar2 = (undefined8 *)(uVar22 + 0xd0 + lVar17);
          local_988 = *puVar2;
          uStack_980 = puVar2[1];
          pfVar1 = (float *)(uVar22 + lVar17);
          fVar82 = *pfVar1;
          fVar83 = pfVar1[1];
          fVar84 = pfVar1[2];
          fVar85 = pfVar1[3];
          pfVar1 = (float *)(uVar22 + 0x10 + lVar17);
          fVar73 = *pfVar1;
          fVar79 = pfVar1[1];
          fVar80 = pfVar1[2];
          fVar81 = pfVar1[3];
          pfVar1 = (float *)(uVar22 + 0x20 + lVar17);
          fVar61 = *pfVar1;
          fVar66 = pfVar1[1];
          fVar68 = pfVar1[2];
          fVar71 = pfVar1[3];
          pfVar1 = (float *)(uVar22 + 0x30 + lVar17);
          fVar86 = fVar82 - *pfVar1;
          fVar87 = fVar83 - pfVar1[1];
          fVar88 = fVar84 - pfVar1[2];
          fVar89 = fVar85 - pfVar1[3];
          pfVar3 = (float *)(uVar22 + 0x90 + lVar17);
          pfVar1 = (float *)(uVar22 + 0x40 + lVar17);
          fVar28 = fVar73 - *pfVar1;
          fVar32 = fVar79 - pfVar1[1];
          fVar34 = fVar80 - pfVar1[2];
          fVar36 = fVar81 - pfVar1[3];
          pfVar1 = (float *)(uVar22 + 0x50 + lVar17);
          fVar106 = fVar61 - *pfVar1;
          fVar108 = fVar66 - pfVar1[1];
          fVar110 = fVar68 - pfVar1[2];
          fVar112 = fVar71 - pfVar1[3];
          fVar41 = *pfVar3 - fVar82;
          fVar51 = pfVar3[1] - fVar83;
          fVar55 = pfVar3[2] - fVar84;
          fVar59 = pfVar3[3] - fVar85;
          pfVar1 = (float *)(uVar22 + 0xa0 + lVar17);
          fVar38 = *pfVar1 - fVar73;
          fVar48 = pfVar1[1] - fVar79;
          fVar52 = pfVar1[2] - fVar80;
          fVar56 = pfVar1[3] - fVar81;
          pfVar1 = (float *)(uVar22 + 0xb0 + lVar17);
          fVar98 = *pfVar1 - fVar61;
          fVar100 = pfVar1[1] - fVar66;
          fVar102 = pfVar1[2] - fVar68;
          fVar104 = pfVar1[3] - fVar71;
          local_938._0_4_ = fVar106 * fVar38 - fVar28 * fVar98;
          local_938._4_4_ = fVar108 * fVar48 - fVar32 * fVar100;
          fStack_930 = fVar110 * fVar52 - fVar34 * fVar102;
          fStack_92c = fVar112 * fVar56 - fVar36 * fVar104;
          fVar91 = *(float *)(ray + k * 4);
          fVar96 = *(float *)(ray + k * 4 + 0x10);
          fVar69 = *(float *)(ray + k * 4 + 0x40);
          fVar72 = *(float *)(ray + k * 4 + 0x50);
          fVar82 = fVar82 - fVar91;
          fVar83 = fVar83 - fVar91;
          fVar84 = fVar84 - fVar91;
          fVar85 = fVar85 - fVar91;
          fVar73 = fVar73 - fVar96;
          fVar79 = fVar79 - fVar96;
          fVar80 = fVar80 - fVar96;
          fVar81 = fVar81 - fVar96;
          fVar114 = fVar82 * fVar72 - fVar73 * fVar69;
          fVar115 = fVar83 * fVar72 - fVar79 * fVar69;
          fVar116 = fVar84 * fVar72 - fVar80 * fVar69;
          fVar117 = fVar85 * fVar72 - fVar81 * fVar69;
          local_928 = fVar86 * fVar98 - fVar106 * fVar41;
          fStack_924 = fVar87 * fVar100 - fVar108 * fVar51;
          fStack_920 = fVar88 * fVar102 - fVar110 * fVar55;
          fStack_91c = fVar89 * fVar104 - fVar112 * fVar59;
          fVar91 = *(float *)(ray + k * 4 + 0x20);
          fVar96 = *(float *)(ray + k * 4 + 0x60);
          fVar61 = fVar61 - fVar91;
          fVar66 = fVar66 - fVar91;
          fVar68 = fVar68 - fVar91;
          fVar71 = fVar71 - fVar91;
          fVar118 = fVar61 * fVar69 - fVar82 * fVar96;
          fVar120 = fVar66 * fVar69 - fVar83 * fVar96;
          fVar122 = fVar68 * fVar69 - fVar84 * fVar96;
          fVar124 = fVar71 * fVar69 - fVar85 * fVar96;
          local_918 = fVar28 * fVar41 - fVar86 * fVar38;
          fStack_914 = fVar32 * fVar51 - fVar87 * fVar48;
          fStack_910 = fVar34 * fVar55 - fVar88 * fVar52;
          fStack_90c = fVar36 * fVar59 - fVar89 * fVar56;
          fVar107 = fVar73 * fVar96 - fVar61 * fVar72;
          fVar109 = fVar79 * fVar96 - fVar66 * fVar72;
          fVar111 = fVar80 * fVar96 - fVar68 * fVar72;
          fVar113 = fVar81 * fVar96 - fVar71 * fVar72;
          fVar91 = fVar69 * (float)local_938._0_4_ + fVar72 * local_928 + fVar96 * local_918;
          fVar92 = fVar69 * (float)local_938._4_4_ + fVar72 * fStack_924 + fVar96 * fStack_914;
          fVar94 = fVar69 * fStack_930 + fVar72 * fStack_920 + fVar96 * fStack_910;
          fVar96 = fVar69 * fStack_92c + fVar72 * fStack_91c + fVar96 * fStack_90c;
          uVar90 = (uint)fVar91 & 0x80000000;
          uVar29 = (uint)fVar92 & 0x80000000;
          uVar33 = (uint)fVar94 & 0x80000000;
          uVar35 = (uint)fVar96 & 0x80000000;
          local_978._0_4_ = (uint)(fVar41 * fVar107 + fVar38 * fVar118 + fVar98 * fVar114) ^ uVar90;
          local_978._4_4_ = (uint)(fVar51 * fVar109 + fVar48 * fVar120 + fVar100 * fVar115) ^ uVar29
          ;
          fStack_970 = (float)((uint)(fVar55 * fVar111 + fVar52 * fVar122 + fVar102 * fVar116) ^
                              uVar33);
          fStack_96c = (float)((uint)(fVar59 * fVar113 + fVar56 * fVar124 + fVar104 * fVar117) ^
                              uVar35);
          local_968 = (float)((uint)(fVar107 * fVar86 + fVar118 * fVar28 + fVar114 * fVar106) ^
                             uVar90);
          fStack_964 = (float)((uint)(fVar109 * fVar87 + fVar120 * fVar32 + fVar115 * fVar108) ^
                              uVar29);
          fStack_960 = (float)((uint)(fVar111 * fVar88 + fVar122 * fVar34 + fVar116 * fVar110) ^
                              uVar33);
          fStack_95c = (float)((uint)(fVar113 * fVar89 + fVar124 * fVar36 + fVar117 * fVar112) ^
                              uVar35);
          local_948 = ABS(fVar91);
          fStack_944 = ABS(fVar92);
          fStack_940 = ABS(fVar94);
          fStack_93c = ABS(fVar96);
          bVar27 = ((0.0 <= local_968 && 0.0 <= (float)local_978._0_4_) && fVar91 != 0.0) &&
                   (float)local_978._0_4_ + local_968 <= local_948;
          bVar11 = ((0.0 <= fStack_964 && 0.0 <= (float)local_978._4_4_) && fVar92 != 0.0) &&
                   (float)local_978._4_4_ + fStack_964 <= fStack_944;
          bVar12 = ((0.0 <= fStack_960 && 0.0 <= fStack_970) && fVar94 != 0.0) &&
                   fStack_970 + fStack_960 <= fStack_940;
          bVar13 = ((0.0 <= fStack_95c && 0.0 <= fStack_96c) && fVar96 != 0.0) &&
                   fStack_96c + fStack_95c <= fStack_93c;
          lVar19 = lVar17 + uVar22;
          auVar64._4_4_ = -(uint)bVar11;
          auVar64._0_4_ = -(uint)bVar27;
          auVar64._8_4_ = -(uint)bVar12;
          auVar64._12_4_ = -(uint)bVar13;
          iVar15 = movmskps((int)lVar17,auVar64);
          if (iVar15 != 0) {
            local_958 = (float)(uVar90 ^ (uint)(fVar82 * (float)local_938._0_4_ +
                                               fVar73 * local_928 + fVar61 * local_918));
            fStack_954 = (float)(uVar29 ^ (uint)(fVar83 * (float)local_938._4_4_ +
                                                fVar79 * fStack_924 + fVar66 * fStack_914));
            fStack_950 = (float)(uVar33 ^ (uint)(fVar84 * fStack_930 +
                                                fVar80 * fStack_920 + fVar68 * fStack_910));
            fStack_94c = (float)(uVar35 ^ (uint)(fVar85 * fStack_92c +
                                                fVar81 * fStack_91c + fVar71 * fStack_90c));
            fVar91 = *(float *)(ray + k * 4 + 0x30);
            fVar96 = *(float *)(ray + k * 4 + 0x80);
            auVar74._0_4_ = fVar96 * local_948;
            auVar74._4_4_ = fVar96 * fStack_944;
            auVar74._8_4_ = fVar96 * fStack_940;
            auVar74._12_4_ = fVar96 * fStack_93c;
            local_908._0_4_ =
                 -(uint)((fVar91 * local_948 < local_958 && local_958 <= auVar74._0_4_) && bVar27);
            local_908._4_4_ =
                 -(uint)((fVar91 * fStack_944 < fStack_954 && fStack_954 <= auVar74._4_4_) && bVar11
                        );
            local_908._8_4_ =
                 -(uint)((fVar91 * fStack_940 < fStack_950 && fStack_950 <= auVar74._8_4_) && bVar12
                        );
            local_908._12_4_ =
                 -(uint)((fVar91 * fStack_93c < fStack_94c && fStack_94c <= auVar74._12_4_) &&
                        bVar13);
            iVar15 = movmskps(iVar15,local_908);
            if (iVar15 != 0) {
              local_898._8_8_ = uStack_7e0;
              local_898._0_8_ = local_7e8;
              local_a50 = context->scene;
              auVar9._4_4_ = fStack_944;
              auVar9._0_4_ = local_948;
              auVar9._8_4_ = fStack_940;
              auVar9._12_4_ = fStack_93c;
              auVar77 = rcpps(auVar74,auVar9);
              fVar91 = auVar77._0_4_;
              fVar96 = auVar77._4_4_;
              fVar69 = auVar77._8_4_;
              fVar72 = auVar77._12_4_;
              fVar82 = (float)DAT_01feca10;
              fVar83 = DAT_01feca10._4_4_;
              fVar84 = DAT_01feca10._8_4_;
              fVar85 = DAT_01feca10._12_4_;
              fVar91 = (fVar82 - local_948 * fVar91) * fVar91 + fVar91;
              fVar96 = (fVar83 - fStack_944 * fVar96) * fVar96 + fVar96;
              fVar69 = (fVar84 - fStack_940 * fVar69) * fVar69 + fVar69;
              fVar72 = (fVar85 - fStack_93c * fVar72) * fVar72 + fVar72;
              local_8d8[0] = local_958 * fVar91;
              local_8d8[1] = fStack_954 * fVar96;
              local_8d8[2] = fStack_950 * fVar69;
              local_8d8[3] = fStack_94c * fVar72;
              auVar42._0_4_ = (float)local_978._0_4_ * fVar91;
              auVar42._4_4_ = (float)local_978._4_4_ * fVar96;
              auVar42._8_4_ = fStack_970 * fVar69;
              auVar42._12_4_ = fStack_96c * fVar72;
              auVar77 = minps(auVar42,_DAT_01feca10);
              auVar62._0_4_ = fVar91 * local_968;
              auVar62._4_4_ = fVar96 * fStack_964;
              auVar62._8_4_ = fVar69 * fStack_960;
              auVar62._12_4_ = fVar72 * fStack_95c;
              auVar64 = minps(auVar62,_DAT_01feca10);
              auVar75._0_4_ = fVar82 - auVar77._0_4_;
              auVar75._4_4_ = fVar83 - auVar77._4_4_;
              auVar75._8_4_ = fVar84 - auVar77._8_4_;
              auVar75._12_4_ = fVar85 - auVar77._12_4_;
              local_8f8 = blendvps(auVar77,auVar75,local_898);
              auVar7._4_4_ = fVar83 - auVar64._4_4_;
              auVar7._0_4_ = fVar82 - auVar64._0_4_;
              auVar7._8_4_ = fVar84 - auVar64._8_4_;
              auVar7._12_4_ = fVar85 - auVar64._12_4_;
              local_8e8 = blendvps(auVar64,auVar7,local_898);
              local_8c8._4_4_ = local_938._4_4_;
              local_8c8._0_4_ = local_938._0_4_;
              fStack_8c0 = fStack_930;
              fStack_8bc = fStack_92c;
              local_8b8[0] = local_928;
              local_8b8[1] = fStack_924;
              local_8b8[2] = fStack_920;
              local_8b8[3] = fStack_91c;
              local_8a8[0] = local_918;
              local_8a8[1] = fStack_914;
              local_8a8[2] = fStack_910;
              local_8a8[3] = fStack_90c;
              local_ad8 = (ulong)(byte)iVar15;
              fVar69 = local_9f8;
              fVar84 = fStack_9f4;
              fVar85 = fStack_9f0;
              fVar73 = fStack_9ec;
              fVar72 = local_a08;
              fVar79 = fStack_a04;
              fVar80 = fStack_a00;
              fVar81 = fStack_9fc;
              fVar82 = local_a18;
              fVar61 = fStack_a14;
              fVar66 = fStack_a10;
              fVar68 = fStack_a0c;
              fVar83 = local_a28;
              fVar71 = fStack_a24;
              fVar41 = fStack_a20;
              fVar51 = fStack_a1c;
              iVar15 = local_a38;
              iVar93 = iStack_a34;
              iVar95 = iStack_a30;
              iVar97 = iStack_a2c;
              iVar99 = local_a48;
              iVar101 = iStack_a44;
              iVar103 = iStack_a40;
              iVar105 = iStack_a3c;
              fVar91 = local_9d8;
              fVar55 = fStack_9d4;
              fVar59 = fStack_9d0;
              fVar86 = fStack_9cc;
              fVar96 = local_9e8;
              fVar87 = fStack_9e4;
              fVar88 = fStack_9e0;
              fVar89 = fStack_9dc;
              do {
                uVar20 = 0;
                if (local_ad8 != 0) {
                  for (; (local_ad8 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                  }
                }
                local_828 = *(uint *)(lVar19 + 0xc0 + uVar20 * 4);
                local_a58 = (ulong)local_828;
                pGVar4 = (local_a50->geometries).items[local_a58].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_ad8 = local_ad8 ^ 1L << (uVar20 & 0x3f);
                  bVar27 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar27 = false;
                }
                else {
                  uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_858 = *(undefined4 *)(local_8f8 + uVar20 * 4);
                  fVar91 = local_8d8[uVar20 - 4];
                  *(float *)(ray + k * 4 + 0x80) = local_8d8[uVar20];
                  args.context = context->user;
                  local_838 = *(undefined4 *)((long)&local_988 + uVar20 * 4);
                  local_848._4_4_ = fVar91;
                  local_848._0_4_ = fVar91;
                  local_848._8_4_ = fVar91;
                  local_848._12_4_ = fVar91;
                  local_888 = local_8b8[uVar20 - 4];
                  local_878 = local_8b8[uVar20];
                  local_868 = local_8a8[uVar20];
                  fStack_884 = local_888;
                  fStack_880 = local_888;
                  fStack_87c = local_888;
                  fStack_874 = local_878;
                  fStack_870 = local_878;
                  fStack_86c = local_878;
                  fStack_864 = local_868;
                  fStack_860 = local_868;
                  fStack_85c = local_868;
                  uStack_854 = local_858;
                  uStack_850 = local_858;
                  uStack_84c = local_858;
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  uStack_824 = local_828;
                  uStack_820 = local_828;
                  uStack_81c = local_828;
                  local_818 = (args.context)->instID[0];
                  uStack_814 = local_818;
                  uStack_810 = local_818;
                  uStack_80c = local_818;
                  local_808 = (args.context)->instPrimID[0];
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  local_a98 = *local_9c8;
                  args.valid = (int *)local_a98;
                  args.geometryUserPtr = pGVar4->userPtr;
                  args.hit = (RTCHitN *)&local_888;
                  args.N = 4;
                  pRVar18 = (RTCRayN *)pGVar4->occlusionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar18 != (RTCRayN *)0x0) {
                    pRVar18 = (RTCRayN *)(*(code *)pRVar18)(&args);
                  }
                  if (local_a98 == (undefined1  [16])0x0) {
                    auVar43._8_4_ = 0xffffffff;
                    auVar43._0_8_ = 0xffffffffffffffff;
                    auVar43._12_4_ = 0xffffffff;
                    auVar43 = auVar43 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var5)(&args);
                    }
                    auVar30._0_4_ = -(uint)(local_a98._0_4_ == 0);
                    auVar30._4_4_ = -(uint)(local_a98._4_4_ == 0);
                    auVar30._8_4_ = -(uint)(local_a98._8_4_ == 0);
                    auVar30._12_4_ = -(uint)(local_a98._12_4_ == 0);
                    auVar43 = auVar30 ^ _DAT_01febe20;
                    auVar77 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar30
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar77;
                    pRVar18 = args.ray;
                  }
                  auVar44._0_4_ = auVar43._0_4_ << 0x1f;
                  auVar44._4_4_ = auVar43._4_4_ << 0x1f;
                  auVar44._8_4_ = auVar43._8_4_ << 0x1f;
                  auVar44._12_4_ = auVar43._12_4_ << 0x1f;
                  iVar15 = movmskps((int)pRVar18,auVar44);
                  bVar27 = iVar15 == 0;
                  fVar69 = local_9f8;
                  fVar84 = fStack_9f4;
                  fVar85 = fStack_9f0;
                  fVar73 = fStack_9ec;
                  fVar72 = local_a08;
                  fVar79 = fStack_a04;
                  fVar80 = fStack_a00;
                  fVar81 = fStack_9fc;
                  fVar82 = local_a18;
                  fVar61 = fStack_a14;
                  fVar66 = fStack_a10;
                  fVar68 = fStack_a0c;
                  fVar83 = local_a28;
                  fVar71 = fStack_a24;
                  fVar41 = fStack_a20;
                  fVar51 = fStack_a1c;
                  iVar15 = local_a38;
                  iVar93 = iStack_a34;
                  iVar95 = iStack_a30;
                  iVar97 = iStack_a2c;
                  iVar99 = local_a48;
                  iVar101 = iStack_a44;
                  iVar103 = iStack_a40;
                  iVar105 = iStack_a3c;
                  fVar91 = local_9d8;
                  fVar55 = fStack_9d4;
                  fVar59 = fStack_9d0;
                  fVar86 = fStack_9cc;
                  fVar96 = local_9e8;
                  fVar87 = fStack_9e4;
                  fVar88 = fStack_9e0;
                  fVar89 = fStack_9dc;
                  if (bVar27) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar14;
                    local_ad8 = local_ad8 ^ 1L << (uVar20 & 0x3f);
                  }
                }
                if (!bVar27) goto LAB_0027fa88;
              } while (local_ad8 != 0);
              iVar15 = 0;
            }
          }
          fVar82 = *(float *)(lVar19 + 0x60);
          fVar83 = *(float *)(lVar19 + 100);
          fVar84 = *(float *)(lVar19 + 0x68);
          fVar85 = *(float *)(lVar19 + 0x6c);
          fVar28 = fVar82 - *(float *)(lVar19 + 0x90);
          fVar32 = fVar83 - *(float *)(lVar19 + 0x94);
          fVar34 = fVar84 - *(float *)(lVar19 + 0x98);
          fVar36 = fVar85 - *(float *)(lVar19 + 0x9c);
          fVar73 = *(float *)(lVar19 + 0x70);
          fVar79 = *(float *)(lVar19 + 0x74);
          fVar80 = *(float *)(lVar19 + 0x78);
          fVar81 = *(float *)(lVar19 + 0x7c);
          fVar102 = fVar73 - *(float *)(lVar19 + 0xa0);
          fVar104 = fVar79 - *(float *)(lVar19 + 0xa4);
          fVar106 = fVar80 - *(float *)(lVar19 + 0xa8);
          fVar107 = fVar81 - *(float *)(lVar19 + 0xac);
          fVar61 = *(float *)(lVar19 + 0x80);
          fVar66 = *(float *)(lVar19 + 0x84);
          fVar68 = *(float *)(lVar19 + 0x88);
          fVar71 = *(float *)(lVar19 + 0x8c);
          fVar110 = fVar61 - *(float *)(lVar19 + 0xb0);
          fVar112 = fVar66 - *(float *)(lVar19 + 0xb4);
          fVar114 = fVar68 - *(float *)(lVar19 + 0xb8);
          fVar116 = fVar71 - *(float *)(lVar19 + 0xbc);
          fVar86 = *(float *)(lVar19 + 0x30) - fVar82;
          fVar87 = *(float *)(lVar19 + 0x34) - fVar83;
          fVar88 = *(float *)(lVar19 + 0x38) - fVar84;
          fVar89 = *(float *)(lVar19 + 0x3c) - fVar85;
          fVar38 = *(float *)(lVar19 + 0x40) - fVar73;
          fVar48 = *(float *)(lVar19 + 0x44) - fVar79;
          fVar52 = *(float *)(lVar19 + 0x48) - fVar80;
          fVar56 = *(float *)(lVar19 + 0x4c) - fVar81;
          fVar92 = *(float *)(lVar19 + 0x50) - fVar61;
          fVar94 = *(float *)(lVar19 + 0x54) - fVar66;
          fVar98 = *(float *)(lVar19 + 0x58) - fVar68;
          fVar100 = *(float *)(lVar19 + 0x5c) - fVar71;
          fVar41 = fVar110 * fVar38 - fVar102 * fVar92;
          fVar51 = fVar112 * fVar48 - fVar104 * fVar94;
          fVar55 = fVar114 * fVar52 - fVar106 * fVar98;
          fVar59 = fVar116 * fVar56 - fVar107 * fVar100;
          fVar91 = *(float *)(ray + k * 4);
          fVar96 = *(float *)(ray + k * 4 + 0x10);
          fVar69 = *(float *)(ray + k * 4 + 0x40);
          fVar72 = *(float *)(ray + k * 4 + 0x50);
          fVar82 = fVar82 - fVar91;
          fVar83 = fVar83 - fVar91;
          fVar84 = fVar84 - fVar91;
          fVar85 = fVar85 - fVar91;
          fVar73 = fVar73 - fVar96;
          fVar79 = fVar79 - fVar96;
          fVar80 = fVar80 - fVar96;
          fVar81 = fVar81 - fVar96;
          fVar118 = fVar82 * fVar72 - fVar73 * fVar69;
          fVar120 = fVar83 * fVar72 - fVar79 * fVar69;
          fVar122 = fVar84 * fVar72 - fVar80 * fVar69;
          fVar124 = fVar85 * fVar72 - fVar81 * fVar69;
          local_928 = fVar28 * fVar92 - fVar110 * fVar86;
          fStack_924 = fVar32 * fVar94 - fVar112 * fVar87;
          fStack_920 = fVar34 * fVar98 - fVar114 * fVar88;
          fStack_91c = fVar36 * fVar100 - fVar116 * fVar89;
          fVar91 = *(float *)(ray + k * 4 + 0x20);
          fVar96 = *(float *)(ray + k * 4 + 0x60);
          fVar61 = fVar61 - fVar91;
          fVar66 = fVar66 - fVar91;
          fVar68 = fVar68 - fVar91;
          fVar71 = fVar71 - fVar91;
          fVar119 = fVar61 * fVar69 - fVar82 * fVar96;
          fVar121 = fVar66 * fVar69 - fVar83 * fVar96;
          fVar123 = fVar68 * fVar69 - fVar84 * fVar96;
          fVar125 = fVar71 * fVar69 - fVar85 * fVar96;
          local_918 = fVar102 * fVar86 - fVar28 * fVar38;
          fStack_914 = fVar104 * fVar87 - fVar32 * fVar48;
          fStack_910 = fVar106 * fVar88 - fVar34 * fVar52;
          fStack_90c = fVar107 * fVar89 - fVar36 * fVar56;
          fVar111 = fVar73 * fVar96 - fVar61 * fVar72;
          fVar113 = fVar79 * fVar96 - fVar66 * fVar72;
          fVar115 = fVar80 * fVar96 - fVar68 * fVar72;
          fVar117 = fVar81 * fVar96 - fVar71 * fVar72;
          fVar91 = fVar69 * fVar41 + fVar72 * local_928 + fVar96 * local_918;
          fVar108 = fVar69 * fVar51 + fVar72 * fStack_924 + fVar96 * fStack_914;
          fVar109 = fVar69 * fVar55 + fVar72 * fStack_920 + fVar96 * fStack_910;
          fVar96 = fVar69 * fVar59 + fVar72 * fStack_91c + fVar96 * fStack_90c;
          uVar90 = (uint)fVar91 & 0x80000000;
          uVar29 = (uint)fVar108 & 0x80000000;
          uVar33 = (uint)fVar109 & 0x80000000;
          uVar35 = (uint)fVar96 & 0x80000000;
          local_978._0_4_ = (uint)(fVar86 * fVar111 + fVar38 * fVar119 + fVar92 * fVar118) ^ uVar90;
          local_978._4_4_ = (uint)(fVar87 * fVar113 + fVar48 * fVar121 + fVar94 * fVar120) ^ uVar29;
          fStack_970 = (float)((uint)(fVar88 * fVar115 + fVar52 * fVar123 + fVar98 * fVar122) ^
                              uVar33);
          fStack_96c = (float)((uint)(fVar89 * fVar117 + fVar56 * fVar125 + fVar100 * fVar124) ^
                              uVar35);
          local_968 = (float)((uint)(fVar111 * fVar28 + fVar119 * fVar102 + fVar118 * fVar110) ^
                             uVar90);
          fStack_964 = (float)((uint)(fVar113 * fVar32 + fVar121 * fVar104 + fVar120 * fVar112) ^
                              uVar29);
          fStack_960 = (float)((uint)(fVar115 * fVar34 + fVar123 * fVar106 + fVar122 * fVar114) ^
                              uVar33);
          fStack_95c = (float)((uint)(fVar117 * fVar36 + fVar125 * fVar107 + fVar124 * fVar116) ^
                              uVar35);
          local_948 = ABS(fVar91);
          fStack_944 = ABS(fVar108);
          fStack_940 = ABS(fVar109);
          fStack_93c = ABS(fVar96);
          bVar27 = ((0.0 <= local_968 && 0.0 <= (float)local_978._0_4_) && fVar91 != 0.0) &&
                   (float)local_978._0_4_ + local_968 <= local_948;
          bVar11 = ((0.0 <= fStack_964 && 0.0 <= (float)local_978._4_4_) && fVar108 != 0.0) &&
                   (float)local_978._4_4_ + fStack_964 <= fStack_944;
          bVar12 = ((0.0 <= fStack_960 && 0.0 <= fStack_970) && fVar109 != 0.0) &&
                   fStack_970 + fStack_960 <= fStack_940;
          bVar13 = ((0.0 <= fStack_95c && 0.0 <= fStack_96c) && fVar96 != 0.0) &&
                   fStack_96c + fStack_95c <= fStack_93c;
          auVar10._4_4_ = -(uint)bVar11;
          auVar10._0_4_ = -(uint)bVar27;
          auVar10._8_4_ = -(uint)bVar12;
          auVar10._12_4_ = -(uint)bVar13;
          iVar15 = movmskps(iVar15,auVar10);
          if (iVar15 != 0) {
            local_958 = (float)(uVar90 ^ (uint)(fVar82 * fVar41 +
                                               fVar73 * local_928 + fVar61 * local_918));
            fStack_954 = (float)(uVar29 ^ (uint)(fVar83 * fVar51 +
                                                fVar79 * fStack_924 + fVar66 * fStack_914));
            fStack_950 = (float)(uVar33 ^ (uint)(fVar84 * fVar55 +
                                                fVar80 * fStack_920 + fVar68 * fStack_910));
            fStack_94c = (float)(uVar35 ^ (uint)(fVar85 * fVar59 +
                                                fVar81 * fStack_91c + fVar71 * fStack_90c));
            fVar91 = *(float *)(ray + k * 4 + 0x30);
            fVar96 = *(float *)(ray + k * 4 + 0x80);
            auVar76._0_4_ = fVar96 * local_948;
            auVar76._4_4_ = fVar96 * fStack_944;
            auVar76._8_4_ = fVar96 * fStack_940;
            auVar76._12_4_ = fVar96 * fStack_93c;
            local_908._0_4_ =
                 -(uint)((local_958 <= auVar76._0_4_ && fVar91 * local_948 < local_958) && bVar27);
            local_908._4_4_ =
                 -(uint)((fStack_954 <= auVar76._4_4_ && fVar91 * fStack_944 < fStack_954) && bVar11
                        );
            local_908._8_4_ =
                 -(uint)((fStack_950 <= auVar76._8_4_ && fVar91 * fStack_940 < fStack_950) && bVar12
                        );
            local_908._12_4_ =
                 -(uint)((fStack_94c <= auVar76._12_4_ && fVar91 * fStack_93c < fStack_94c) &&
                        bVar13);
            iVar15 = movmskps(iVar15,local_908);
            if (iVar15 != 0) {
              fStack_930 = fVar55;
              local_938 = (undefined1  [8])CONCAT44(fVar51,fVar41);
              fStack_92c = fVar59;
              local_898 = local_7f8;
              local_a50 = context->scene;
              auVar8._4_4_ = fStack_944;
              auVar8._0_4_ = local_948;
              auVar8._8_4_ = fStack_940;
              auVar8._12_4_ = fStack_93c;
              auVar77 = rcpps(auVar76,auVar8);
              fVar91 = auVar77._0_4_;
              fVar96 = auVar77._4_4_;
              fVar69 = auVar77._8_4_;
              fVar72 = auVar77._12_4_;
              fVar82 = (float)DAT_01feca10;
              fVar83 = DAT_01feca10._4_4_;
              fVar84 = DAT_01feca10._8_4_;
              fVar85 = DAT_01feca10._12_4_;
              fVar91 = (fVar82 - local_948 * fVar91) * fVar91 + fVar91;
              fVar96 = (fVar83 - fStack_944 * fVar96) * fVar96 + fVar96;
              fVar69 = (fVar84 - fStack_940 * fVar69) * fVar69 + fVar69;
              fVar72 = (fVar85 - fStack_93c * fVar72) * fVar72 + fVar72;
              local_8d8[0] = local_958 * fVar91;
              local_8d8[1] = fStack_954 * fVar96;
              local_8d8[2] = fStack_950 * fVar69;
              local_8d8[3] = fStack_94c * fVar72;
              auVar45._0_4_ = (float)local_978._0_4_ * fVar91;
              auVar45._4_4_ = (float)local_978._4_4_ * fVar96;
              auVar45._8_4_ = fStack_970 * fVar69;
              auVar45._12_4_ = fStack_96c * fVar72;
              auVar77 = minps(auVar45,_DAT_01feca10);
              auVar63._0_4_ = fVar91 * local_968;
              auVar63._4_4_ = fVar96 * fStack_964;
              auVar63._8_4_ = fVar69 * fStack_960;
              auVar63._12_4_ = fVar72 * fStack_95c;
              auVar64 = minps(auVar63,_DAT_01feca10);
              auVar78._0_4_ = fVar82 - auVar77._0_4_;
              auVar78._4_4_ = fVar83 - auVar77._4_4_;
              auVar78._8_4_ = fVar84 - auVar77._8_4_;
              auVar78._12_4_ = fVar85 - auVar77._12_4_;
              local_8f8 = blendvps(auVar77,auVar78,local_7f8);
              auVar6._4_4_ = fVar83 - auVar64._4_4_;
              auVar6._0_4_ = fVar82 - auVar64._0_4_;
              auVar6._8_4_ = fVar84 - auVar64._8_4_;
              auVar6._12_4_ = fVar85 - auVar64._12_4_;
              local_8e8 = blendvps(auVar64,auVar6,local_7f8);
              fStack_8c0 = fVar55;
              local_8c8 = (undefined1  [8])CONCAT44(fVar51,fVar41);
              fStack_8bc = fVar59;
              local_8b8[0] = local_928;
              local_8b8[1] = fStack_924;
              local_8b8[2] = fStack_920;
              local_8b8[3] = fStack_91c;
              local_8a8[0] = local_918;
              local_8a8[1] = fStack_914;
              local_8a8[2] = fStack_910;
              local_8a8[3] = fStack_90c;
              local_ad8 = (ulong)(byte)iVar15;
              fVar69 = local_9f8;
              fVar84 = fStack_9f4;
              fVar85 = fStack_9f0;
              fVar73 = fStack_9ec;
              fVar72 = local_a08;
              fVar79 = fStack_a04;
              fVar80 = fStack_a00;
              fVar81 = fStack_9fc;
              fVar82 = local_a18;
              fVar61 = fStack_a14;
              fVar66 = fStack_a10;
              fVar68 = fStack_a0c;
              fVar83 = local_a28;
              fVar71 = fStack_a24;
              fVar41 = fStack_a20;
              fVar51 = fStack_a1c;
              iVar15 = local_a38;
              iVar93 = iStack_a34;
              iVar95 = iStack_a30;
              iVar97 = iStack_a2c;
              iVar99 = local_a48;
              iVar101 = iStack_a44;
              iVar103 = iStack_a40;
              iVar105 = iStack_a3c;
              fVar91 = local_9d8;
              fVar55 = fStack_9d4;
              fVar59 = fStack_9d0;
              fVar86 = fStack_9cc;
              fVar96 = local_9e8;
              fVar87 = fStack_9e4;
              fVar88 = fStack_9e0;
              fVar89 = fStack_9dc;
              do {
                uVar20 = 0;
                if (local_ad8 != 0) {
                  for (; (local_ad8 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                  }
                }
                local_828 = *(uint *)(lVar19 + 0xc0 + uVar20 * 4);
                local_a58 = (ulong)local_828;
                pGVar4 = (local_a50->geometries).items[local_a58].ptr;
                if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  local_ad8 = local_ad8 ^ 1L << (uVar20 & 0x3f);
                  bVar27 = true;
                }
                else if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                        (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  bVar27 = false;
                }
                else {
                  uVar14 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_858 = *(undefined4 *)(local_8f8 + uVar20 * 4);
                  fVar91 = local_8d8[uVar20 - 4];
                  *(float *)(ray + k * 4 + 0x80) = local_8d8[uVar20];
                  args.context = context->user;
                  local_838 = *(undefined4 *)((long)&local_988 + uVar20 * 4);
                  local_848._4_4_ = fVar91;
                  local_848._0_4_ = fVar91;
                  local_848._8_4_ = fVar91;
                  local_848._12_4_ = fVar91;
                  local_888 = local_8b8[uVar20 - 4];
                  local_878 = local_8b8[uVar20];
                  local_868 = local_8a8[uVar20];
                  fStack_884 = local_888;
                  fStack_880 = local_888;
                  fStack_87c = local_888;
                  fStack_874 = local_878;
                  fStack_870 = local_878;
                  fStack_86c = local_878;
                  fStack_864 = local_868;
                  fStack_860 = local_868;
                  fStack_85c = local_868;
                  uStack_854 = local_858;
                  uStack_850 = local_858;
                  uStack_84c = local_858;
                  uStack_834 = local_838;
                  uStack_830 = local_838;
                  uStack_82c = local_838;
                  uStack_824 = local_828;
                  uStack_820 = local_828;
                  uStack_81c = local_828;
                  local_818 = (args.context)->instID[0];
                  uStack_814 = local_818;
                  uStack_810 = local_818;
                  uStack_80c = local_818;
                  local_808 = (args.context)->instPrimID[0];
                  uStack_804 = local_808;
                  uStack_800 = local_808;
                  uStack_7fc = local_808;
                  local_a98 = *local_9c8;
                  args.valid = (int *)local_a98;
                  args.geometryUserPtr = pGVar4->userPtr;
                  args.hit = (RTCHitN *)&local_888;
                  args.N = 4;
                  pRVar18 = (RTCRayN *)pGVar4->occlusionFilterN;
                  args.ray = (RTCRayN *)ray;
                  if (pRVar18 != (RTCRayN *)0x0) {
                    pRVar18 = (RTCRayN *)(*(code *)pRVar18)(&args);
                  }
                  if (local_a98 == (undefined1  [16])0x0) {
                    auVar46._8_4_ = 0xffffffff;
                    auVar46._0_8_ = 0xffffffffffffffff;
                    auVar46._12_4_ = 0xffffffff;
                    auVar46 = auVar46 ^ _DAT_01febe20;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var5)(&args);
                    }
                    auVar31._0_4_ = -(uint)(local_a98._0_4_ == 0);
                    auVar31._4_4_ = -(uint)(local_a98._4_4_ == 0);
                    auVar31._8_4_ = -(uint)(local_a98._8_4_ == 0);
                    auVar31._12_4_ = -(uint)(local_a98._12_4_ == 0);
                    auVar46 = auVar31 ^ _DAT_01febe20;
                    auVar77 = blendvps(_DAT_01feba00,*(undefined1 (*) [16])(args.ray + 0x80),auVar31
                                      );
                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar77;
                    pRVar18 = args.ray;
                  }
                  auVar47._0_4_ = auVar46._0_4_ << 0x1f;
                  auVar47._4_4_ = auVar46._4_4_ << 0x1f;
                  auVar47._8_4_ = auVar46._8_4_ << 0x1f;
                  auVar47._12_4_ = auVar46._12_4_ << 0x1f;
                  iVar15 = movmskps((int)pRVar18,auVar47);
                  bVar27 = iVar15 == 0;
                  fVar69 = local_9f8;
                  fVar84 = fStack_9f4;
                  fVar85 = fStack_9f0;
                  fVar73 = fStack_9ec;
                  fVar72 = local_a08;
                  fVar79 = fStack_a04;
                  fVar80 = fStack_a00;
                  fVar81 = fStack_9fc;
                  fVar82 = local_a18;
                  fVar61 = fStack_a14;
                  fVar66 = fStack_a10;
                  fVar68 = fStack_a0c;
                  fVar83 = local_a28;
                  fVar71 = fStack_a24;
                  fVar41 = fStack_a20;
                  fVar51 = fStack_a1c;
                  iVar15 = local_a38;
                  iVar93 = iStack_a34;
                  iVar95 = iStack_a30;
                  iVar97 = iStack_a2c;
                  iVar99 = local_a48;
                  iVar101 = iStack_a44;
                  iVar103 = iStack_a40;
                  iVar105 = iStack_a3c;
                  fVar91 = local_9d8;
                  fVar55 = fStack_9d4;
                  fVar59 = fStack_9d0;
                  fVar86 = fStack_9cc;
                  fVar96 = local_9e8;
                  fVar87 = fStack_9e4;
                  fVar88 = fStack_9e0;
                  fVar89 = fStack_9dc;
                  if (bVar27) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar14;
                    local_ad8 = local_ad8 ^ 1L << (uVar20 & 0x3f);
                  }
                }
                if (!bVar27) goto LAB_0027fa88;
              } while (local_ad8 != 0);
            }
          }
          uVar23 = uVar23 + 1;
          bVar26 = uVar23 < local_a88;
        } while (uVar23 != local_a88);
        uVar90 = 0;
        uVar22 = local_9c0;
        fVar69 = local_9f8;
        fVar84 = fStack_9f4;
        fVar85 = fStack_9f0;
        fVar73 = fStack_9ec;
        fVar72 = local_a08;
        fVar79 = fStack_a04;
        fVar80 = fStack_a00;
        fVar81 = fStack_9fc;
        fVar82 = local_a18;
        fVar61 = fStack_a14;
        fVar66 = fStack_a10;
        fVar68 = fStack_a0c;
        fVar83 = local_a28;
        fVar71 = fStack_a24;
        fVar41 = fStack_a20;
        fVar51 = fStack_a1c;
        iVar15 = local_a38;
        iVar93 = iStack_a34;
        iVar95 = iStack_a30;
        iVar97 = iStack_a2c;
        iVar99 = local_a48;
        iVar101 = iStack_a44;
        iVar103 = iStack_a40;
        iVar105 = iStack_a3c;
        fVar91 = local_9d8;
        fVar55 = fStack_9d4;
        fVar59 = fStack_9d0;
        fVar86 = fStack_9cc;
        fVar96 = local_9e8;
        fVar87 = fStack_9e4;
        fVar88 = fStack_9e0;
        fVar89 = fStack_9dc;
      }
    }
    goto LAB_0027fa7e;
  }
  goto LAB_0027fab7;
LAB_0027fa88:
  uVar90 = 0;
  uVar22 = local_9c0;
  if (bVar26) {
    *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
    uVar90 = 1;
  }
LAB_0027fa7e:
  if ((uVar90 & 3) != 0) {
LAB_0027fab7:
    return pNVar21 != stack;
  }
  goto LAB_0027eb75;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }